

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# var_based_part.c
# Opt level: O0

void fill_variance_tree_leaves
               (AV1_COMP *cpi,MACROBLOCK *x,VP128x128 *vt,PART_EVAL_STATUS *force_split,
               int (*avg_16x16) [4],int (*maxvar_16x16) [4],int (*minvar_16x16) [4],
               int64_t *thresholds,uint8_t *src_buf,int src_stride,uint8_t *dst_buf,int dst_stride,
               _Bool is_key_frame,_Bool is_small_sb)

{
  undefined2 uVar1;
  int iVar2;
  int iVar3;
  int pixels_wide_00;
  int iVar4;
  int iVar5;
  MACROBLOCKD *xd_00;
  VPartVar *v;
  long lVar6;
  undefined1 *in_RCX;
  long in_RDX;
  long in_RSI;
  long in_R8;
  long in_R9;
  long in_stack_00000008;
  long in_stack_00000010;
  uint8_t *in_stack_00000018;
  int in_stack_00000020;
  uint8_t *in_stack_00000028;
  byte in_stack_00000038;
  byte in_stack_00000040;
  int thresh_minmax;
  int minmax;
  int val_none_var;
  VPartVar *none_var;
  VP8x8 *vst2;
  int y8_idx;
  int x8_idx;
  int lvl3_idx;
  VP16x16 *vst;
  int split_index;
  int y16_idx;
  int x16_idx;
  int lvl2_idx;
  int lvl1_scale_idx;
  int y32_idx;
  int x32_idx;
  int lvl1_idx;
  int blk64_scale_idx;
  int y64_idx;
  int x64_idx;
  int blk64_idx;
  int temporal_denoising;
  int border_offset_4x4;
  int pixels_high;
  int pixels_wide;
  int segment_id;
  int compute_minmax_variance;
  int num_64x64_blocks;
  MACROBLOCKD *xd;
  int in_stack_fffffffffffffee4;
  int in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffeec;
  uint8_t *in_stack_fffffffffffffef0;
  int in_stack_fffffffffffffef8;
  int in_stack_fffffffffffffefc;
  uint8_t *in_stack_ffffffffffffff00;
  int in_stack_ffffffffffffff10;
  undefined1 *puVar7;
  long lVar8;
  int local_a4;
  uint local_88;
  uint local_78;
  uint local_68;
  
  xd_00 = (MACROBLOCKD *)(in_RSI + 0x1a0);
  iVar2 = 4;
  if ((in_stack_00000040 & 1) != 0) {
    iVar2 = 1;
  }
  uVar1 = *(undefined2 *)(**(long **)(in_RSI + 0x2058) + 0xa7);
  puVar7 = in_RCX;
  lVar8 = in_RDX;
  for (local_68 = 0; (int)local_68 < iVar2; local_68 = local_68 + 1) {
    iVar3 = local_68 * 4;
    in_RCX[(int)(local_68 + 1)] = 0;
    for (local_78 = 0; (int)local_78 < 4; local_78 = local_78 + 1) {
      in_RCX[(int)(iVar3 + 5 + local_78)] = 0;
      *(undefined4 *)(in_R8 + (long)(int)local_68 * 0x10 + (long)(int)local_78 * 4) = 0;
      *(undefined4 *)(in_R9 + (long)(int)local_68 * 0x10 + (long)(int)local_78 * 4) = 0;
      *(undefined4 *)(in_stack_00000008 + (long)(int)local_68 * 0x10 + (long)(int)local_78 * 4) =
           0x7fffffff;
      for (local_88 = 0; (int)local_88 < 4; local_88 = local_88 + 1) {
        pixels_wide_00 = (local_68 & 1) * 0x40 + (local_78 & 1) * 0x20 + (local_88 & 1) * 0x10;
        iVar4 = ((int)local_68 >> 1) * 0x40 + ((int)local_78 >> 1) * 0x20 +
                ((int)local_88 >> 1) * 0x10;
        iVar5 = (iVar3 + local_78) * 4 + 0x15 + local_88;
        in_RCX[iVar5] = 0;
        if ((in_stack_00000038 & 1) == 0) {
          in_stack_fffffffffffffef0 = in_stack_00000018;
          in_stack_fffffffffffffefc = in_stack_00000020;
          in_stack_ffffffffffffff00 = in_stack_00000028;
          is_cur_buf_hbd(xd_00);
          fill_variance_8x8avg
                    (in_stack_ffffffffffffff00,in_stack_fffffffffffffefc,in_stack_fffffffffffffef0,
                     in_stack_fffffffffffffeec,in_stack_fffffffffffffee8,in_stack_fffffffffffffee4,
                     (VP16x16 *)CONCAT44(iVar4,pixels_wide_00),(int)puVar7,(int)lVar8,(int)in_RSI);
          fill_variance_tree(in_stack_fffffffffffffef0,
                             (BLOCK_SIZE)((uint)in_stack_fffffffffffffeec >> 0x18));
          v = (VPartVar *)
              (*(long *)(in_RDX + 0x50) + (long)(int)local_68 * 0xaa90 +
               (long)(int)local_78 * 0x2a90 + 0xa0 + (long)(int)local_88 * 0xa90);
          get_variance(v);
          iVar4 = v->variance;
          lVar6 = in_R8 + (long)(int)local_68 * 0x10;
          *(int *)(lVar6 + (long)(int)local_78 * 4) =
               iVar4 + *(int *)(lVar6 + (long)(int)local_78 * 4);
          in_stack_fffffffffffffeec = iVar4;
          if (*(int *)(in_stack_00000008 + (long)(int)local_68 * 0x10 + (long)(int)local_78 * 4) <
              iVar4) {
            in_stack_fffffffffffffeec =
                 *(int *)(in_stack_00000008 + (long)(int)local_68 * 0x10 + (long)(int)local_78 * 4);
          }
          *(int *)(in_stack_00000008 + (long)(int)local_68 * 0x10 + (long)(int)local_78 * 4) =
               in_stack_fffffffffffffeec;
          in_stack_fffffffffffffee8 = iVar4;
          if (iVar4 < *(int *)(in_R9 + (long)(int)local_68 * 0x10 + (long)(int)local_78 * 4)) {
            in_stack_fffffffffffffee8 =
                 *(int *)(in_R9 + (long)(int)local_68 * 0x10 + (long)(int)local_78 * 4);
          }
          *(int *)(in_R9 + (long)(int)local_68 * 0x10 + (long)(int)local_78 * 4) =
               in_stack_fffffffffffffee8;
          if (*(long *)(in_stack_00000010 + 0x18) < (long)iVar4) {
            in_RCX[iVar5] = 1;
            in_RCX[(int)(iVar3 + 5 + local_78)] = 1;
            in_RCX[(int)(local_68 + 1)] = 1;
            *in_RCX = 1;
          }
          else {
            cyclic_refresh_segment_id_boosted((uint)((byte)uVar1 & 7));
          }
        }
        else {
          pixels_wide_00 = in_stack_ffffffffffffff10;
          for (local_a4 = 0; local_a4 < 4; local_a4 = local_a4 + 1) {
            fill_variance_4x4avg
                      (in_stack_ffffffffffffff00,in_stack_fffffffffffffefc,in_stack_fffffffffffffef8
                       ,(int)((ulong)in_stack_fffffffffffffef0 >> 0x20),
                       (VP8x8 *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                       in_stack_fffffffffffffee4,pixels_wide_00,(int)puVar7,(int)lVar8);
          }
        }
        in_stack_ffffffffffffff10 = pixels_wide_00;
      }
    }
  }
  return;
}

Assistant:

static void fill_variance_tree_leaves(
    AV1_COMP *cpi, MACROBLOCK *x, VP128x128 *vt, PART_EVAL_STATUS *force_split,
    int avg_16x16[][4], int maxvar_16x16[][4], int minvar_16x16[][4],
    int64_t *thresholds, const uint8_t *src_buf, int src_stride,
    const uint8_t *dst_buf, int dst_stride, bool is_key_frame,
    const bool is_small_sb) {
  MACROBLOCKD *xd = &x->e_mbd;
  const int num_64x64_blocks = is_small_sb ? 1 : 4;
  // TODO(kyslov) Bring back compute_minmax_variance with content type detection
  const int compute_minmax_variance = 0;
  const int segment_id = xd->mi[0]->segment_id;
  int pixels_wide = 128, pixels_high = 128;
  int border_offset_4x4 = 0;
  int temporal_denoising = cpi->sf.rt_sf.use_rtc_tf;
  // dst_buf pointer is not used for is_key_frame, so it should be NULL.
  assert(IMPLIES(is_key_frame, dst_buf == NULL));
  if (is_small_sb) {
    pixels_wide = 64;
    pixels_high = 64;
  }
  if (xd->mb_to_right_edge < 0) pixels_wide += (xd->mb_to_right_edge >> 3);
  if (xd->mb_to_bottom_edge < 0) pixels_high += (xd->mb_to_bottom_edge >> 3);
#if CONFIG_AV1_TEMPORAL_DENOISING
  temporal_denoising |= cpi->oxcf.noise_sensitivity;
#endif
  // For temporal filtering or temporal denoiser enabled: since the source
  // is modified we need to avoid 4x4 avg along superblock boundary, since
  // simd code will load 8 pixels for 4x4 avg and so can access source
  // data outside superblock (while its being modified by temporal filter).
  // Temporal filtering is never done on key frames.
  if (!is_key_frame && temporal_denoising) border_offset_4x4 = 4;
  for (int blk64_idx = 0; blk64_idx < num_64x64_blocks; blk64_idx++) {
    const int x64_idx = GET_BLK_IDX_X(blk64_idx, 6);
    const int y64_idx = GET_BLK_IDX_Y(blk64_idx, 6);
    const int blk64_scale_idx = blk64_idx << 2;
    force_split[blk64_idx + 1] = PART_EVAL_ALL;

    for (int lvl1_idx = 0; lvl1_idx < 4; lvl1_idx++) {
      const int x32_idx = x64_idx + GET_BLK_IDX_X(lvl1_idx, 5);
      const int y32_idx = y64_idx + GET_BLK_IDX_Y(lvl1_idx, 5);
      const int lvl1_scale_idx = (blk64_scale_idx + lvl1_idx) << 2;
      force_split[5 + blk64_scale_idx + lvl1_idx] = PART_EVAL_ALL;
      avg_16x16[blk64_idx][lvl1_idx] = 0;
      maxvar_16x16[blk64_idx][lvl1_idx] = 0;
      minvar_16x16[blk64_idx][lvl1_idx] = INT_MAX;
      for (int lvl2_idx = 0; lvl2_idx < 4; lvl2_idx++) {
        const int x16_idx = x32_idx + GET_BLK_IDX_X(lvl2_idx, 4);
        const int y16_idx = y32_idx + GET_BLK_IDX_Y(lvl2_idx, 4);
        const int split_index = 21 + lvl1_scale_idx + lvl2_idx;
        VP16x16 *vst = &vt->split[blk64_idx].split[lvl1_idx].split[lvl2_idx];
        force_split[split_index] = PART_EVAL_ALL;
        if (is_key_frame) {
          // Go down to 4x4 down-sampling for variance.
          for (int lvl3_idx = 0; lvl3_idx < 4; lvl3_idx++) {
            const int x8_idx = x16_idx + GET_BLK_IDX_X(lvl3_idx, 3);
            const int y8_idx = y16_idx + GET_BLK_IDX_Y(lvl3_idx, 3);
            VP8x8 *vst2 = &vst->split[lvl3_idx];
            fill_variance_4x4avg(src_buf, src_stride, x8_idx, y8_idx, vst2,
#if CONFIG_AV1_HIGHBITDEPTH
                                 xd->cur_buf->flags,
#endif
                                 pixels_wide, pixels_high, border_offset_4x4);
          }
        } else {
          fill_variance_8x8avg(src_buf, src_stride, dst_buf, dst_stride,
                               x16_idx, y16_idx, vst, is_cur_buf_hbd(xd),
                               pixels_wide, pixels_high);

          fill_variance_tree(vst, BLOCK_16X16);
          VPartVar *none_var = &vt->split[blk64_idx]
                                    .split[lvl1_idx]
                                    .split[lvl2_idx]
                                    .part_variances.none;
          get_variance(none_var);
          const int val_none_var = none_var->variance;
          avg_16x16[blk64_idx][lvl1_idx] += val_none_var;
          minvar_16x16[blk64_idx][lvl1_idx] =
              AOMMIN(minvar_16x16[blk64_idx][lvl1_idx], val_none_var);
          maxvar_16x16[blk64_idx][lvl1_idx] =
              AOMMAX(maxvar_16x16[blk64_idx][lvl1_idx], val_none_var);
          if (val_none_var > thresholds[3]) {
            // 16X16 variance is above threshold for split, so force split to
            // 8x8 for this 16x16 block (this also forces splits for upper
            // levels).
            force_split[split_index] = PART_EVAL_ONLY_SPLIT;
            force_split[5 + blk64_scale_idx + lvl1_idx] = PART_EVAL_ONLY_SPLIT;
            force_split[blk64_idx + 1] = PART_EVAL_ONLY_SPLIT;
            force_split[0] = PART_EVAL_ONLY_SPLIT;
          } else if (!cyclic_refresh_segment_id_boosted(segment_id) &&
                     compute_minmax_variance && val_none_var > thresholds[2]) {
            // We have some nominal amount of 16x16 variance (based on average),
            // compute the minmax over the 8x8 sub-blocks, and if above
            // threshold, force split to 8x8 block for this 16x16 block.
            int minmax = compute_minmax_8x8(src_buf, src_stride, dst_buf,
                                            dst_stride, x16_idx, y16_idx,
#if CONFIG_AV1_HIGHBITDEPTH
                                            xd->cur_buf->flags,
#endif
                                            pixels_wide, pixels_high);
            const int thresh_minmax = (int)cpi->vbp_info.threshold_minmax;
            if (minmax > thresh_minmax) {
              force_split[split_index] = PART_EVAL_ONLY_SPLIT;
              force_split[5 + blk64_scale_idx + lvl1_idx] =
                  PART_EVAL_ONLY_SPLIT;
              force_split[blk64_idx + 1] = PART_EVAL_ONLY_SPLIT;
              force_split[0] = PART_EVAL_ONLY_SPLIT;
            }
          }
        }
      }
    }
  }
}